

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_3,_2> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::decrement<float,3,2>
          (Matrix<float,_3,_2> *__return_storage_ptr__,MatrixCaseUtils *this,
          Matrix<float,_3,_2> *mat)

{
  long lVar1;
  
  tcu::Matrix<float,_3,_2>::Matrix(__return_storage_ptr__);
  for (lVar1 = -0xc; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(float *)((long)(__return_storage_ptr__->m_data).m_data[1].m_data + lVar1) =
         *(float *)(this + lVar1 + 0xc) + -1.0;
    *(float *)((long)__return_storage_ptr__[1].m_data.m_data[0].m_data + lVar1) =
         *(float *)(this + lVar1 + 0x18) + -1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Rows, Cols> decrement (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) - 1.0f;

	return retVal;
}